

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O3

TestCaseGroup * vkt::texture::createFilteringAnisotropyTests(TestContext *testCtx)

{
  string *psVar1;
  FilterMode FVar2;
  FilterMode FVar3;
  TestNode *pTVar4;
  bool bVar5;
  undefined4 uVar6;
  FilteringAnisotropyTests *pFVar7;
  long *plVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  AnisotropyParams refParams;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  TestNode *local_1d8;
  TestNode *local_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  float local_1a4;
  TestContext *local_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  string *local_178;
  long local_170;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  ulong local_148 [2];
  TestNode *local_138;
  TestNode *local_130;
  string *local_128 [2];
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  long local_f8 [2];
  long local_e8;
  ulong local_e0;
  AnisotropyParams local_d4;
  
  local_138 = (TestNode *)operator_new(0x70);
  local_1a0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_138,testCtx,"filtering_anisotropy","Filtering anisotropy tests")
  ;
  local_1d8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1d8,local_1a0,"basic","Filtering anisotropy tests");
  local_130 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_130,local_1a0,"mipmap","Filtering anisotropy tests");
  lVar13 = 0;
  do {
    local_1d0 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1d0,local_1a0,(&PTR_anon_var_dwarf_1a53b77_00d04010)[lVar13],
               "Filtering anisotropy tests");
    local_1a4 = (float)(&DAT_00b29bc0)[lVar13];
    uVar6 = 0xb29b01;
    lVar15 = 0;
    local_e8 = lVar13;
    do {
      local_e0 = CONCAT44(local_e0._4_4_,uVar6);
      FVar2 = tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar15];
      lVar13 = 0;
      bVar5 = true;
      do {
        bVar12 = bVar5;
        FVar3 = tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar13];
        glu::TextureTestUtil::ReferenceParams::ReferenceParams
                  (&local_d4.super_ReferenceParams,TEXTURETYPE_2D);
        local_d4.maxAnisotropy = local_1a4;
        local_d4.mipMap = false;
        local_d4.minFilter = FVar2;
        local_d4.magFilter = FVar3;
        pFVar7 = (FilteringAnisotropyTests *)operator_new(0x118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_118 + 0x10),(char *)(&DAT_00d04030)[lVar13],&local_1d9);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)(local_118 + 0x10),0,(char *)0x0,0xaf981d);
        local_198 = &local_188;
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_188 = *plVar9;
          lStack_180 = plVar8[3];
        }
        else {
          local_188 = *plVar9;
          local_198 = (long *)*plVar8;
        }
        local_190 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
        local_1c8 = &local_1b8;
        puVar10 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar10) {
          local_1b8 = *puVar10;
          lStack_1b0 = plVar8[3];
        }
        else {
          local_1b8 = *puVar10;
          local_1c8 = (ulong *)*plVar8;
        }
        local_1c0 = plVar8[1];
        *plVar8 = (long)puVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_168 + 0x10),(char *)(&DAT_00d04030)[lVar15],&local_1da);
        uVar11 = 0xf;
        if (local_1c8 != &local_1b8) {
          uVar11 = local_1b8;
        }
        if (uVar11 < (ulong)(local_158._8_8_ + local_1c0)) {
          uVar11 = 0xf;
          if ((ulong *)local_158._M_allocated_capacity != local_148) {
            uVar11 = local_148[0];
          }
          if (uVar11 < (ulong)(local_158._8_8_ + local_1c0)) goto LAB_007f7a7c;
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)(local_168 + 0x10),0,(char *)0x0,(ulong)local_1c8);
        }
        else {
LAB_007f7a7c:
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1c8,local_158._M_allocated_capacity);
        }
        psVar1 = (string *)(plVar8 + 2);
        if ((string *)*plVar8 == psVar1) {
          local_168._0_8_ = (psVar1->_M_dataplus)._M_p;
          local_168._8_4_ = (undefined4)plVar8[3];
          local_168._12_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          local_178 = (string *)local_168;
        }
        else {
          local_168._0_8_ = (psVar1->_M_dataplus)._M_p;
          local_178 = (string *)*plVar8;
        }
        local_170 = plVar8[1];
        *plVar8 = (long)psVar1;
        plVar8[1] = 0;
        *(undefined1 *)&(psVar1->_M_dataplus)._M_p = 0;
        local_128[0] = (string *)local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,"Texture filtering anisotropy basic tests","");
        anon_unknown_0::FilteringAnisotropyTests::FilteringAnisotropyTests
                  (pFVar7,local_1a0,local_178,local_128[0],&local_d4);
        tcu::TestNode::addChild(local_1d0,(TestNode *)pFVar7);
        if (local_128[0] != (string *)local_118) {
          operator_delete(local_128[0],(ulong)(local_118._0_8_ + 1));
        }
        if (local_178 != (string *)local_168) {
          operator_delete(local_178,(ulong)(local_168._0_8_ + 1));
        }
        if ((ulong *)local_158._M_allocated_capacity != local_148) {
          operator_delete((void *)local_158._M_allocated_capacity,local_148[0] + 1);
        }
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8,local_1b8 + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if ((long *)local_108._M_allocated_capacity != local_f8) {
          operator_delete((void *)local_108._M_allocated_capacity,local_f8[0] + 1);
        }
        lVar13 = 1;
        bVar5 = false;
      } while (bVar12);
      lVar15 = 1;
      uVar6 = 0;
    } while ((local_e0 & 1) != 0);
    tcu::TestNode::addChild(local_1d8,local_1d0);
    lVar13 = local_e8 + 1;
  } while (lVar13 != 4);
  tcu::TestNode::addChild(local_138,local_1d8);
  lVar13 = 0;
  do {
    local_1d0 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1d0,local_1a0,(&PTR_anon_var_dwarf_1a53b77_00d04010)[lVar13],
               "Filtering anisotropy tests");
    local_1a4 = (float)(&DAT_00b29bc0)[lVar13];
    uVar11 = 0;
    local_e8 = lVar13;
    do {
      FVar2 = (&DAT_00b29bd0)[uVar11];
      lVar13 = 0;
      bVar5 = true;
      local_e0 = uVar11;
      do {
        bVar12 = bVar5;
        FVar3 = tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar13];
        glu::TextureTestUtil::ReferenceParams::ReferenceParams
                  (&local_d4.super_ReferenceParams,TEXTURETYPE_2D);
        local_d4.maxAnisotropy = local_1a4;
        local_d4.mipMap = true;
        local_d4.minFilter = FVar2;
        local_d4.magFilter = FVar3;
        pFVar7 = (FilteringAnisotropyTests *)operator_new(0x118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_118 + 0x10),(char *)(&DAT_00d04030)[lVar13],&local_1d9);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)(local_118 + 0x10),0,(char *)0x0,0xaf981d);
        local_198 = &local_188;
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_188 = *plVar9;
          lStack_180 = plVar8[3];
        }
        else {
          local_188 = *plVar9;
          local_198 = (long *)*plVar8;
        }
        local_190 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
        local_1c8 = &local_1b8;
        puVar10 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar10) {
          local_1b8 = *puVar10;
          lStack_1b0 = plVar8[3];
        }
        else {
          local_1b8 = *puVar10;
          local_1c8 = (ulong *)*plVar8;
        }
        local_1c0 = plVar8[1];
        *plVar8 = (long)puVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_168 + 0x10),
                   (char *)((long)&DAT_00b29db0 + (long)(int)(&DAT_00b29db0)[uVar11]),&local_1da);
        uVar14 = 0xf;
        if (local_1c8 != &local_1b8) {
          uVar14 = local_1b8;
        }
        if (uVar14 < (ulong)(local_158._8_8_ + local_1c0)) {
          uVar14 = 0xf;
          if ((ulong *)local_158._M_allocated_capacity != local_148) {
            uVar14 = local_148[0];
          }
          if (uVar14 < (ulong)(local_158._8_8_ + local_1c0)) goto LAB_007f7e6b;
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)(local_168 + 0x10),0,(char *)0x0,(ulong)local_1c8);
        }
        else {
LAB_007f7e6b:
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1c8,local_158._M_allocated_capacity);
        }
        psVar1 = (string *)(plVar8 + 2);
        if ((string *)*plVar8 == psVar1) {
          local_168._0_8_ = (psVar1->_M_dataplus)._M_p;
          local_168._8_4_ = (undefined4)plVar8[3];
          local_168._12_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
          local_178 = (string *)local_168;
        }
        else {
          local_168._0_8_ = (psVar1->_M_dataplus)._M_p;
          local_178 = (string *)*plVar8;
        }
        local_170 = plVar8[1];
        *plVar8 = (long)psVar1;
        plVar8[1] = 0;
        *(undefined1 *)&(psVar1->_M_dataplus)._M_p = 0;
        local_128[0] = (string *)local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,"Texture filtering anisotropy basic tests","");
        anon_unknown_0::FilteringAnisotropyTests::FilteringAnisotropyTests
                  (pFVar7,local_1a0,local_178,local_128[0],&local_d4);
        tcu::TestNode::addChild(local_1d0,(TestNode *)pFVar7);
        if (local_128[0] != (string *)local_118) {
          operator_delete(local_128[0],(ulong)(local_118._0_8_ + 1));
        }
        if (local_178 != (string *)local_168) {
          operator_delete(local_178,(ulong)(local_168._0_8_ + 1));
        }
        if ((ulong *)local_158._M_allocated_capacity != local_148) {
          operator_delete((void *)local_158._M_allocated_capacity,local_148[0] + 1);
        }
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8,local_1b8 + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if ((long *)local_108._M_allocated_capacity != local_f8) {
          operator_delete((void *)local_108._M_allocated_capacity,local_f8[0] + 1);
        }
        lVar13 = 1;
        bVar5 = false;
      } while (bVar12);
      uVar11 = local_e0 + 1;
    } while (uVar11 != 4);
    tcu::TestNode::addChild(local_130,local_1d0);
    pTVar4 = local_138;
    lVar13 = local_e8 + 1;
    if (lVar13 == 4) {
      tcu::TestNode::addChild(local_138,local_130);
      return (TestCaseGroup *)pTVar4;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createFilteringAnisotropyTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	filteringAnisotropyTests	(new tcu::TestCaseGroup(testCtx,	"filtering_anisotropy",	"Filtering anisotropy tests"));
	de::MovePtr<tcu::TestCaseGroup>	basicTests					(new tcu::TestCaseGroup(testCtx, "basic", "Filtering anisotropy tests"));
	de::MovePtr<tcu::TestCaseGroup>	mipmapTests					(new tcu::TestCaseGroup(testCtx, "mipmap", "Filtering anisotropy tests"));
	const char*						valueName[]					=
	{
		"anisotropy_2",
		"anisotropy_4",
		"anisotropy_8",
		"anisotropy_max"
	};
	const float						maxAnisotropy[]				=
	{
		2.0f,
		4.0f,
		8.0f,
		10000.0f	//too huge will be flated to max value
	};
	const char*						magFilterName[]				=
	{
		"nearest",
		"linear"
	};
	const tcu::Sampler::FilterMode	magFilters[]				=
	{
		Sampler::NEAREST,
		Sampler::LINEAR
	};

	{
		const tcu::Sampler::FilterMode*	minFilters		= magFilters;
		const char**					minFilterName	= magFilterName;

		for (int anisotropyNdx = 0; anisotropyNdx < DE_LENGTH_OF_ARRAY(maxAnisotropy); anisotropyNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup> levelAnisotropyGroups (new tcu::TestCaseGroup(testCtx, valueName[anisotropyNdx], "Filtering anisotropy tests"));

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); minFilterNdx++)
			for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
			{
				AnisotropyParams	refParams	(TEXTURETYPE_2D, maxAnisotropy[anisotropyNdx] ,minFilters[minFilterNdx], magFilters[magFilterNdx]);
				levelAnisotropyGroups->addChild(new FilteringAnisotropyTests(testCtx,
														"mag_" + string(magFilterName[magFilterNdx]) + "_min_" + string(minFilterName[minFilterNdx]),
														"Texture filtering anisotropy basic tests", refParams));
			}
			basicTests->addChild(levelAnisotropyGroups.release());
		}
		filteringAnisotropyTests->addChild(basicTests.release());
	}

	{
		const tcu::Sampler::FilterMode		minFilters[]	=
		{
			Sampler::NEAREST_MIPMAP_NEAREST,
			Sampler::NEAREST_MIPMAP_LINEAR,
			Sampler::LINEAR_MIPMAP_NEAREST,
			Sampler::LINEAR_MIPMAP_LINEAR
		};
		const char*							minFilterName[]	=
		{
			"nearest_mipmap_nearest",
			"nearest_mipmap_linear",
			"linear_mipmap_nearest",
			"linear_mipmap_linear"
		};

		for (int anisotropyNdx = 0; anisotropyNdx < DE_LENGTH_OF_ARRAY(maxAnisotropy); anisotropyNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup> levelAnisotropyGroups (new tcu::TestCaseGroup(testCtx, valueName[anisotropyNdx], "Filtering anisotropy tests"));

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
			for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
			{
				AnisotropyParams	refParams	(TEXTURETYPE_2D, maxAnisotropy[anisotropyNdx] ,minFilters[minFilterNdx], magFilters[magFilterNdx], true);
				levelAnisotropyGroups->addChild(new FilteringAnisotropyTests(testCtx,
														"mag_" + string(magFilterName[magFilterNdx]) + "_min_" + string(minFilterName[minFilterNdx]),
														"Texture filtering anisotropy basic tests", refParams));
			}
			mipmapTests->addChild(levelAnisotropyGroups.release());
		}
		filteringAnisotropyTests->addChild(mipmapTests.release());
	}

	return filteringAnisotropyTests.release();
}